

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLKinematicsIntermediateData.h
# Opt level: O2

void __thiscall COLLADASaxFWL::KinematicAttachment::~KinematicAttachment(KinematicAttachment *this)

{
  (this->super_IntermediateTargetableTemplate<2UL>).super_IntermediateTargetable.
  _vptr_IntermediateTargetable = (_func_int **)&PTR__KinematicAttachment_0095d540;
  deleteVector<COLLADAFW::Transformation*>(&this->mTransformations);
  SidAddress::~SidAddress(&this->mJoint);
  std::_Vector_base<COLLADAFW::Transformation_*,_std::allocator<COLLADAFW::Transformation_*>_>::
  ~_Vector_base(&(this->mTransformations).
                 super__Vector_base<COLLADAFW::Transformation_*,_std::allocator<COLLADAFW::Transformation_*>_>
               );
  KinematicLink::~KinematicLink(&this->mLink);
  return;
}

Assistant:

~KinematicAttachment(){ deleteVector(mTransformations); }